

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

If_DsdMan_t * If_DsdManAlloc(int nVars,int LutSize)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  word wVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  If_DsdMan_t *p;
  size_t sVar6;
  char *__dest;
  uint *puVar7;
  Mem_Flex_t *pMVar8;
  void **ppvVar9;
  int *piVar10;
  If_DsdObj_t *pIVar11;
  Vec_Int_t *pVVar12;
  Vec_Mem_t *pVVar13;
  Vec_Ptr_t *pVVar14;
  void *pvVar15;
  long lVar16;
  long lVar17;
  int i;
  undefined1 *puVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  undefined1 auVar22 [16];
  uint uVar23;
  uint uVar24;
  uint uVar25;
  char pFileName [100];
  char local_98 [104];
  
  if (0xc < nVars) {
    __assert_fail("nVars <= DAU_MAX_VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x10c,"If_DsdMan_t *If_DsdManAlloc(int, int)");
  }
  sprintf(local_98,"%02d.dsd",(ulong)(uint)nVars);
  p = (If_DsdMan_t *)calloc(1,0x2d0);
  sVar6 = strlen(local_98);
  __dest = (char *)malloc(sVar6 + 1);
  strcpy(__dest,local_98);
  p->pStore = __dest;
  p->nVars = nVars;
  p->LutSize = LutSize;
  iVar21 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar21 = 1;
  }
  p->nWords = iVar21;
  uVar20 = 99999;
  while( true ) {
    do {
      uVar23 = uVar20 + 1;
      uVar5 = uVar20 & 1;
      uVar20 = uVar23;
    } while (uVar5 != 0);
    if (uVar23 < 9) break;
    iVar21 = 5;
    while (uVar23 % (iVar21 - 2U) != 0) {
      uVar5 = iVar21 * iVar21;
      iVar21 = iVar21 + 2;
      if (uVar23 < uVar5) goto LAB_0041e5d7;
    }
  }
LAB_0041e5d7:
  p->nBins = uVar23;
  puVar7 = (uint *)calloc((long)(int)uVar23,4);
  p->pBins = puVar7;
  pMVar8 = Mem_FlexStart();
  p->pMem = pMVar8;
  p->nConfigWords = 1;
  ppvVar9 = (void **)malloc(80000);
  (p->vObjs).pArray = ppvVar9;
  (p->vObjs).nCap = 10000;
  piVar10 = (int *)malloc(40000);
  (p->vNexts).pArray = piVar10;
  if (piVar10 != (int *)0x0) {
    (p->vNexts).nCap = 10000;
    piVar10 = (int *)malloc(40000);
    (p->vTruths).pArray = piVar10;
    if (piVar10 != (int *)0x0) {
      (p->vTruths).nCap = 10000;
      If_DsdObjAlloc(p,1,0);
      pIVar11 = If_DsdObjAlloc(p,2,0);
      *(uint *)&pIVar11->field_0x4 = *(uint *)&pIVar11->field_0x4 & 0xffffff07 | 8;
      pVVar12 = (Vec_Int_t *)malloc(0x10);
      pVVar12->nCap = 0x20;
      pVVar12->nSize = 0;
      piVar10 = (int *)malloc(0x80);
      pVVar12->pArray = piVar10;
      p->vTemp1 = pVVar12;
      pVVar12 = (Vec_Int_t *)malloc(0x10);
      pVVar12->nCap = 0x20;
      pVVar12->nSize = 0;
      piVar10 = (int *)malloc(0x80);
      pVVar12->pArray = piVar10;
      p->vTemp2 = pVVar12;
      auVar4 = _DAT_0093d220;
      if (If_ManDsdTtElems_pTtElems == 0) {
        lVar16 = 1;
        puVar18 = If_ManDsdTtElems_TtElems;
        auVar22 = _DAT_0093d210;
        do {
          if (SUB164(auVar22 ^ auVar4,4) == -0x80000000 && SUB164(auVar22 ^ auVar4,0) < -0x7ffffff3)
          {
            *(undefined1 **)(If_ManDsdTtElems_TtElems + lVar16 * 8 + 0x19f8) = puVar18;
            (&If_ManDsdTtElems_pTtElems)[lVar16] = (long)(puVar18 + 0x200);
          }
          lVar17 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 2;
          auVar22._8_8_ = lVar17 + 2;
          lVar16 = lVar16 + 2;
          puVar18 = puVar18 + 0x400;
        } while (lVar16 != 0xf);
        uVar19 = 0;
        do {
          lVar16 = (&If_ManDsdTtElems_pTtElems)[uVar19];
          if (uVar19 < 6) {
            wVar3 = s_Truths6[uVar19];
            uVar2 = *(undefined4 *)((long)s_Truths6 + uVar19 * 8 + 4);
            lVar17 = 0;
            do {
              puVar1 = (undefined4 *)(lVar16 + lVar17 * 8);
              *puVar1 = (int)wVar3;
              puVar1[1] = uVar2;
              puVar1[2] = (int)wVar3;
              puVar1[3] = uVar2;
              lVar17 = lVar17 + 2;
            } while (lVar17 != 0x40);
          }
          else {
            uVar5 = 1 << ((char)uVar19 - 6U & 0x1f);
            lVar17 = 0;
            uVar20 = 0;
            uVar23 = 1;
            do {
              uVar24 = uVar5 & uVar20;
              uVar25 = uVar5 & uVar23;
              puVar7 = (uint *)(lVar16 + lVar17 * 8);
              *puVar7 = -(uint)(uVar24 == 0) ^ 0xffffffff;
              puVar7[1] = -(uint)(uVar24 == 0) ^ 0xffffffff;
              puVar7[2] = -(uint)(uVar25 == 0) ^ 0xffffffff;
              puVar7[3] = -(uint)(uVar25 == 0) ^ 0xffffffff;
              lVar17 = lVar17 + 2;
              uVar20 = uVar20 + 2;
              uVar23 = uVar23 + 2;
            } while (lVar17 != 0x40);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != 0xc);
      }
      p->pTtElems = (word **)&If_ManDsdTtElems_pTtElems;
      if (2 < nVars) {
        uVar19 = 3;
        do {
          iVar21 = 1 << ((char)uVar19 - 6U & 0x1f);
          if (uVar19 < 7) {
            iVar21 = 1;
          }
          pVVar13 = (Vec_Mem_t *)calloc(1,0x30);
          pVVar13->nEntrySize = iVar21;
          pVVar13->LogPageSze = 0xc;
          pVVar13->PageMask = 0xfff;
          pVVar13->iPage = -1;
          p->vTtMem[uVar19] = pVVar13;
          uVar20 = 9999;
          while( true ) {
            do {
              uVar23 = uVar20;
              uVar20 = uVar23 + 1;
            } while ((uVar23 & 1) != 0);
            if (uVar20 < 9) break;
            iVar21 = 5;
            while (uVar20 % (iVar21 - 2U) != 0) {
              uVar5 = iVar21 * iVar21;
              iVar21 = iVar21 + 2;
              if (uVar20 < uVar5) goto LAB_0041e8a4;
            }
          }
LAB_0041e8a4:
          pVVar12 = (Vec_Int_t *)malloc(0x10);
          uVar5 = uVar20;
          if (uVar23 < 0xf) {
            uVar5 = 0x10;
          }
          pVVar12->nCap = uVar5;
          piVar10 = (int *)malloc((long)(int)uVar5 << 2);
          pVVar12->pArray = piVar10;
          pVVar12->nSize = uVar20;
          if (piVar10 != (int *)0x0) {
            memset(piVar10,0xff,(long)(int)uVar20 << 2);
          }
          pVVar13->vTable = pVVar12;
          pVVar12 = (Vec_Int_t *)malloc(0x10);
          pVVar12->nCap = 10000;
          pVVar12->nSize = 0;
          piVar10 = (int *)malloc(40000);
          pVVar12->pArray = piVar10;
          pVVar13->vNexts = pVVar12;
          pVVar14 = (Vec_Ptr_t *)malloc(0x10);
          pVVar14->nCap = 1000;
          pVVar14->nSize = 0;
          ppvVar9 = (void **)malloc(8000);
          pVVar14->pArray = ppvVar9;
          p->vTtDecs[uVar19] = pVVar14;
          uVar19 = uVar19 + 1;
        } while (uVar19 != nVars + 1);
        lVar16 = 0;
        do {
          piVar10 = Extra_GreyCodeSchedule((int)lVar16 + 2);
          p->pSched[lVar16 + 2] = piVar10;
          lVar16 = lVar16 + 1;
        } while ((ulong)(uint)nVars - 2 != lVar16);
      }
      if (LutSize != 0) {
        pvVar15 = If_ManSatBuildXY(LutSize);
        p->pSat = pvVar15;
      }
      pVVar12 = (Vec_Int_t *)calloc(1,0x10);
      p->vCover = pVVar12;
      return p;
    }
  }
  __assert_fail("p->pArray",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
}

Assistant:

If_DsdMan_t * If_DsdManAlloc( int nVars, int LutSize )
{
    If_DsdMan_t * p; int v;
    char pFileName[100];
    assert( nVars <= DAU_MAX_VAR );
    sprintf( pFileName, "%02d.dsd", nVars );
    p = ABC_CALLOC( If_DsdMan_t, 1 );
    p->pStore  = Abc_UtilStrsav( pFileName );
    p->nVars   = nVars;
    p->LutSize = LutSize;
    p->nWords  = Abc_TtWordNum( nVars );
    p->nBins   = Abc_PrimeCudd( 100000 );
    p->pBins   = ABC_CALLOC( unsigned, p->nBins );
    p->pMem    = Mem_FlexStart();
    p->nConfigWords = 1;
    Vec_PtrGrow( &p->vObjs, 10000 );
    Vec_IntGrow( &p->vNexts, 10000 );
    Vec_IntGrow( &p->vTruths, 10000 );
    If_DsdObjAlloc( p, IF_DSD_CONST0, 0 );
    If_DsdObjAlloc( p, IF_DSD_VAR, 0 )->nSupp = 1;
    p->vTemp1   = Vec_IntAlloc( 32 );
    p->vTemp2   = Vec_IntAlloc( 32 );
    p->pTtElems = If_ManDsdTtElems();
    for ( v = 3; v <= nVars; v++ )
    {
        p->vTtMem[v] = Vec_MemAlloc( Abc_TtWordNum(v), 12 );
        Vec_MemHashAlloc( p->vTtMem[v], 10000 );
        p->vTtDecs[v] = Vec_PtrAlloc( 1000 );
    }
/*
    p->pTtGia   = Gia_ManStart( nVars );
    Gia_ManHashAlloc( p->pTtGia );
    for ( v = 0; v < nVars; v++ )
        Gia_ManAppendCi( p->pTtGia );
*/
    for ( v = 2; v < nVars; v++ )
        p->pSched[v] = Extra_GreyCodeSchedule( v );
    if ( LutSize )
    p->pSat     = If_ManSatBuildXY( LutSize );
    p->vCover   = Vec_IntAlloc( 0 );
    return p;
}